

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.cc
# Opt level: O2

Regexp * __thiscall
re2::SimplifyWalker::PostVisit
          (SimplifyWalker *this,Regexp *re,Regexp *parent_arg,Regexp *pre_arg,Regexp **child_args,
          int nchild_args)

{
  byte bVar1;
  ushort uVar2;
  bool bVar3;
  ostream *this_00;
  Regexp *pRVar4;
  Regexp *pRVar5;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar6;
  ulong uVar7;
  LogMessage local_1a0;
  
  bVar1 = re->op_;
  switch(bVar1) {
  case 1:
  case 2:
  case 3:
  case 4:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x15:
    goto switchD_001bbbe2_caseD_1;
  case 5:
  case 6:
    bVar3 = ChildArgsChanged(re,child_args);
    if (bVar3) {
      pRVar5 = (Regexp *)operator_new(0x28);
      Regexp::Regexp(pRVar5,(uint)re->op_,(uint)re->parse_flags_);
      Regexp::AllocSub(pRVar5,(uint)re->nsub_);
      if (pRVar5->nsub_ < 2) {
        paVar6 = &pRVar5->field_5;
      }
      else {
        paVar6 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(pRVar5->field_5).submany_;
      }
      uVar2 = re->nsub_;
      for (uVar7 = 0; uVar7 < uVar2; uVar7 = uVar7 + 1) {
        paVar6[uVar7] = *(anon_union_8_2_3df47e5c_for_Regexp_7 *)(child_args + uVar7);
      }
LAB_001bbd91:
      pRVar5->simple_ = '\x01';
      return pRVar5;
    }
    goto switchD_001bbbe2_caseD_1;
  case 7:
  case 8:
  case 9:
    pRVar4 = *child_args;
    if (pRVar4->op_ == 2) {
      return pRVar4;
    }
    if (re->nsub_ < 2) {
      paVar6 = &re->field_5;
    }
    else {
      paVar6 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(re->field_5).submany_;
    }
    if (pRVar4 != (Regexp *)paVar6->submany_) {
      if ((bVar1 == pRVar4->op_) && (re->parse_flags_ == pRVar4->parse_flags_)) {
        return pRVar4;
      }
      pRVar5 = (Regexp *)operator_new(0x28);
      Regexp::Regexp(pRVar5,(uint)bVar1,(uint)re->parse_flags_);
      pRVar5->nsub_ = 1;
      (pRVar5->field_5).subone_ = pRVar4;
      goto LAB_001bbd91;
    }
    break;
  case 10:
    pRVar4 = *child_args;
    if (pRVar4->op_ == '\x02') {
      return pRVar4;
    }
    pRVar5 = SimplifyRepeat(pRVar4,(re->field_7).field_0.min_,(re->field_7).field_0.max_,
                            (uint)re->parse_flags_);
    Regexp::Decref(pRVar4);
    pRVar5->simple_ = '\x01';
    return pRVar5;
  case 0xb:
    pRVar4 = *child_args;
    if (re->nsub_ < 2) {
      paVar6 = &re->field_5;
    }
    else {
      paVar6 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(re->field_5).submany_;
    }
    if (pRVar4 != (Regexp *)paVar6->submany_) {
      pRVar5 = (Regexp *)operator_new(0x28);
      Regexp::Regexp(pRVar5,kRegexpCapture,(uint)re->parse_flags_);
      pRVar5->nsub_ = 1;
      (pRVar5->field_5).subone_ = pRVar4;
      (pRVar5->field_7).field_0.max_ = (re->field_7).field_0.max_;
      goto LAB_001bbd91;
    }
    break;
  case 0x14:
    pRVar4 = SimplifyCharClass(re);
    pRVar4->simple_ = '\x01';
    return pRVar4;
  default:
    LogMessage::LogMessage
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/simplify.cc"
               ,0x22d);
    this_00 = std::operator<<((ostream *)&local_1a0.str_,"Simplify case not handled: ");
    std::ostream::operator<<(this_00,(uint)re->op_);
    LogMessage::~LogMessage(&local_1a0);
    pRVar4 = Regexp::Incref(re);
    return pRVar4;
  }
  Regexp::Decref(pRVar4);
switchD_001bbbe2_caseD_1:
  re->simple_ = '\x01';
  pRVar4 = Regexp::Incref(re);
  return pRVar4;
}

Assistant:

Regexp* SimplifyWalker::PostVisit(Regexp* re,
                                  Regexp* parent_arg,
                                  Regexp* pre_arg,
                                  Regexp** child_args,
                                  int nchild_args) {
  switch (re->op()) {
    case kRegexpNoMatch:
    case kRegexpEmptyMatch:
    case kRegexpLiteral:
    case kRegexpLiteralString:
    case kRegexpBeginLine:
    case kRegexpEndLine:
    case kRegexpBeginText:
    case kRegexpWordBoundary:
    case kRegexpNoWordBoundary:
    case kRegexpEndText:
    case kRegexpAnyChar:
    case kRegexpAnyByte:
    case kRegexpHaveMatch:
      // All these are always simple.
      re->simple_ = true;
      return re->Incref();

    case kRegexpConcat:
    case kRegexpAlternate: {
      // These are simple as long as the subpieces are simple.
      if (!ChildArgsChanged(re, child_args)) {
        re->simple_ = true;
        return re->Incref();
      }
      Regexp* nre = new Regexp(re->op(), re->parse_flags());
      nre->AllocSub(re->nsub());
      Regexp** nre_subs = nre->sub();
      for (int i = 0; i < re->nsub(); i++)
        nre_subs[i] = child_args[i];
      nre->simple_ = true;
      return nre;
    }

    case kRegexpCapture: {
      Regexp* newsub = child_args[0];
      if (newsub == re->sub()[0]) {
        newsub->Decref();
        re->simple_ = true;
        return re->Incref();
      }
      Regexp* nre = new Regexp(kRegexpCapture, re->parse_flags());
      nre->AllocSub(1);
      nre->sub()[0] = newsub;
      nre->cap_ = re->cap();
      nre->simple_ = true;
      return nre;
    }

    case kRegexpStar:
    case kRegexpPlus:
    case kRegexpQuest: {
      Regexp* newsub = child_args[0];
      // Special case: repeat the empty string as much as
      // you want, but it's still the empty string.
      if (newsub->op() == kRegexpEmptyMatch)
        return newsub;

      // These are simple as long as the subpiece is simple.
      if (newsub == re->sub()[0]) {
        newsub->Decref();
        re->simple_ = true;
        return re->Incref();
      }

      // These are also idempotent if flags are constant.
      if (re->op() == newsub->op() &&
          re->parse_flags() == newsub->parse_flags())
        return newsub;

      Regexp* nre = new Regexp(re->op(), re->parse_flags());
      nre->AllocSub(1);
      nre->sub()[0] = newsub;
      nre->simple_ = true;
      return nre;
    }

    case kRegexpRepeat: {
      Regexp* newsub = child_args[0];
      // Special case: repeat the empty string as much as
      // you want, but it's still the empty string.
      if (newsub->op() == kRegexpEmptyMatch)
        return newsub;

      Regexp* nre = SimplifyRepeat(newsub, re->min_, re->max_,
                                   re->parse_flags());
      newsub->Decref();
      nre->simple_ = true;
      return nre;
    }

    case kRegexpCharClass: {
      Regexp* nre = SimplifyCharClass(re);
      nre->simple_ = true;
      return nre;
    }
  }

  LOG(ERROR) << "Simplify case not handled: " << re->op();
  return re->Incref();
}